

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O1

void __thiscall Disk::test(Disk *this)

{
  pointer pcVar1;
  Disk *this_00;
  ostream *poVar2;
  long lVar3;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = (Disk *)operator_new(0x10000);
  Disk(this_00);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"2323","");
  std::__cxx11::string::_M_assign((string *)(this_00->disk_data + 0xea));
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n234: should be 4538:\t",0x16);
  pcVar1 = this_00->disk_data[0xea]._M_dataplus._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + this_00->disk_data[0xea]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b0,local_a8);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n0: should be 0:\t",0x11);
  pcVar1 = this_00->disk_data[0]._M_dataplus._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + this_00->disk_data[0]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b0,local_a8);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"23232","");
  std::__cxx11::string::_M_assign((string *)(this_00->disk_data + 0xeb));
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"34434","");
  std::__cxx11::string::_M_assign((string *)(this_00->disk_data + 0xea));
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n234: should be 2333:\t",0x16);
  pcVar1 = this_00->disk_data[0xea]._M_dataplus._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + this_00->disk_data[0xea]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b0,local_a8);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n235: should be 12344:\t",0x17);
  pcVar1 = this_00->disk_data[0xeb]._M_dataplus._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + this_00->disk_data[0xeb]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b0,local_a8);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n236: should be 0:\t",0x13);
  pcVar1 = this_00->disk_data[0xec]._M_dataplus._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + this_00->disk_data[0xec]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b0,local_a8);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  lVar3 = 0;
  do {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        *(char **)((long)&this->disk_data[0]._M_dataplus._M_p + lVar3),
                        *(long *)((long)&this->disk_data[0]._M_string_length + lVar3));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x10000);
  return;
}

Assistant:

void Disk::test() {
    Disk *disk = new Disk();
    disk->write(234, "2323");
    std::cout << "\n234: should be 4538:\t" << disk->read(234);
    std::cout << "\n0: should be 0:\t" << disk->read(0);
    disk->write(235, "23232");
    disk->write(234, "34434");
    std::cout << "\n234: should be 2333:\t" << disk->read(234);
    std::cout << "\n235: should be 12344:\t" << disk->read(235);
    std::cout << "\n236: should be 0:\t" << disk->read(236);
    for (int i = 0; i < 2048; i++)
        std::cout << disk_data[i] << std::endl;
}